

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O2

void nk_input_button(nk_context *ctx,nk_buttons id,int x,int y,int down)

{
  nk_cursor **ppnVar1;
  ulong uVar2;
  
  if (ctx != (nk_context *)0x0) {
    uVar2 = (ulong)id;
    if ((ctx->input).mouse.buttons[uVar2].down != down) {
      *(ulong *)((long)(ctx->style).cursors + uVar2 * 0x10 + -100) = CONCAT44((float)y,(float)x);
      (ctx->input).mouse.buttons[uVar2].down = down;
      ppnVar1 = (ctx->style).cursors + uVar2 * 2 + -0xd;
      *(int *)ppnVar1 = *(int *)ppnVar1 + 1;
    }
    return;
  }
  __assert_fail("ctx",
                "/workspace/llm4binary/github/license_all_cmakelists_25/anael-seghezzi[P]glfw/deps/nuklear.h"
                ,0x365b,"void nk_input_button(struct nk_context *, enum nk_buttons, int, int, int)")
  ;
}

Assistant:

NK_API void
nk_input_button(struct nk_context *ctx, enum nk_buttons id, int x, int y, int down)
{
    struct nk_mouse_button *btn;
    struct nk_input *in;
    NK_ASSERT(ctx);
    if (!ctx) return;
    in = &ctx->input;
    if (in->mouse.buttons[id].down == down) return;

    btn = &in->mouse.buttons[id];
    btn->clicked_pos.x = (float)x;
    btn->clicked_pos.y = (float)y;
    btn->down = down;
    btn->clicked++;
}